

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTime.c
# Opt level: O2

float Map_MatchComputeReqTimes(Map_Cut_t *pCut,int fPhase,Map_Time_t *ptArrRes)

{
  char cVar1;
  uint uVar2;
  Map_Node_t *pMVar3;
  float *pfVar4;
  long lVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  uVar2 = pCut->M[fPhase].uPhaseBest;
  pfVar4 = &(pCut->M[fPhase].pSuperBest)->tDelaysF[0].Fall;
  ptArrRes->Rise = -3.4028235e+37;
  ptArrRes->Fall = -3.4028235e+37;
  cVar1 = pCut->nLeaves;
  fVar8 = -3.4028235e+37;
  fVar7 = -3.4028235e+37;
  for (lVar5 = 0; lVar5 < cVar1; lVar5 = lVar5 + 1) {
    bVar6 = (~uVar2 >> ((uint)lVar5 & 0x1f) & 1) != 0;
    pMVar3 = pCut->ppLeaves[lVar5];
    if ((0.0 < pfVar4[-0x13]) &&
       (fVar9 = pfVar4[-0x13] + pMVar3->tRequired[bVar6].Rise, fVar7 < fVar9)) {
      ptArrRes->Rise = fVar9;
      fVar7 = fVar9;
    }
    if ((0.0 < pfVar4[-0x12]) &&
       (fVar9 = pfVar4[-0x12] + pMVar3->tRequired[bVar6].Fall, fVar7 < fVar9)) {
      ptArrRes->Rise = fVar9;
      fVar7 = fVar9;
    }
    if ((0.0 < ((Map_Time_t *)(pfVar4 + -1))->Rise) &&
       (fVar9 = ((Map_Time_t *)(pfVar4 + -1))->Rise + pMVar3->tRequired[bVar6].Rise, fVar8 < fVar9))
    {
      ptArrRes->Fall = fVar9;
      fVar8 = fVar9;
    }
    if ((0.0 < *pfVar4) && (fVar9 = *pfVar4 + pMVar3->tRequired[bVar6].Fall, fVar8 < fVar9)) {
      ptArrRes->Fall = fVar9;
      fVar8 = fVar9;
    }
    pfVar4 = pfVar4 + 3;
  }
  if (fVar7 <= fVar8) {
    fVar7 = fVar8;
  }
  return fVar7;
}

Assistant:

float Map_MatchComputeReqTimes( Map_Cut_t * pCut, int fPhase, Map_Time_t * ptArrRes )
{
    Map_Time_t * ptArrIn;
    Map_Super_t * pSuper;
    unsigned uPhaseTot;
    int fPinPhase, i;
    float tDelay;

    // get the supergate and the phase
    pSuper = pCut->M[fPhase].pSuperBest;
    uPhaseTot = pCut->M[fPhase].uPhaseBest;

    // propagate the arrival times 
    ptArrRes->Rise = ptArrRes->Fall = -MAP_FLOAT_LARGE;
    for ( i = 0; i < pCut->nLeaves; i++ )
    {
        // get the phase of the given pin
        fPinPhase = ((uPhaseTot & (1 << i)) == 0);
        ptArrIn = pCut->ppLeaves[i]->tRequired + fPinPhase;
//        assert( ptArrIn->Worst < MAP_FLOAT_LARGE );

        // get the rise of the output due to rise of the inputs
        if ( pSuper->tDelaysR[i].Rise > 0 )
        {
            tDelay = ptArrIn->Rise + pSuper->tDelaysR[i].Rise;
            if ( ptArrRes->Rise < tDelay )
                ptArrRes->Rise = tDelay;
        }

        // get the rise of the output due to fall of the inputs
        if ( pSuper->tDelaysR[i].Fall > 0 )
        {
            tDelay = ptArrIn->Fall + pSuper->tDelaysR[i].Fall;
            if ( ptArrRes->Rise < tDelay )
                ptArrRes->Rise = tDelay;
        }

        // get the fall of the output due to rise of the inputs
        if ( pSuper->tDelaysF[i].Rise > 0 )
        {
            tDelay = ptArrIn->Rise + pSuper->tDelaysF[i].Rise;
            if ( ptArrRes->Fall < tDelay )
                ptArrRes->Fall = tDelay;
        }

        // get the fall of the output due to fall of the inputs
        if ( pSuper->tDelaysF[i].Fall > 0 )
        {
            tDelay = ptArrIn->Fall + pSuper->tDelaysF[i].Fall;
            if ( ptArrRes->Fall < tDelay )
                ptArrRes->Fall = tDelay;
        }
    }
    // return the worst-case of rise/fall arrival times
    return MAP_MAX(ptArrRes->Rise, ptArrRes->Fall);
}